

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_int>_>::size(Delimited<kj::ArrayPtr<const_int>_> *this)

{
  bool bVar1;
  CappedArray<char,_14UL> *pCVar2;
  size_t sVar3;
  CappedArray<char,_14UL> *e;
  CappedArray<char,_14UL> *__end0;
  CappedArray<char,_14UL> *__begin0;
  Array<kj::CappedArray<char,_14UL>_> *__range3;
  size_t sStack_18;
  bool first;
  size_t result;
  Delimited<kj::ArrayPtr<const_int>_> *this_local;
  
  ensureStringifiedInitialized(this);
  sStack_18 = 0;
  bVar1 = true;
  __end0 = Array<kj::CappedArray<char,_14UL>_>::begin(&this->stringified);
  pCVar2 = Array<kj::CappedArray<char,_14UL>_>::end(&this->stringified);
  for (; __end0 != pCVar2; __end0 = __end0 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      sVar3 = StringPtr::size(&this->delimiter);
      sStack_18 = sVar3 + sStack_18;
    }
    sVar3 = CappedArray<char,_14UL>::size(__end0);
    sStack_18 = sVar3 + sStack_18;
  }
  return sStack_18;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }